

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

t_object * __thiscall
xemmai::t_type_of<xemmai::t_object>::
f_derive<xemmai::t_derived<xemmai::t_type_of<xemmai::t_throwable>>>
          (t_type_of<xemmai::t_object> *this,t_object *a_module,t_fields *a_fields)

{
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *ptVar2;
  long in_FS_OFFSET;
  t_object *a_module_local;
  unsigned_long local_78;
  t_type_of<xemmai::t_object> *local_70;
  pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
  local_68;
  
  a_module_local = a_module;
  f_merge(&local_68,this,a_fields);
  ptVar2 = t_engine::f_allocate_for_type<xemmai::t_derived<xemmai::t_type_of<xemmai::t_throwable>>>
                     (*(t_engine **)(in_FS_OFFSET + -0x60),
                      ((long)local_68.first.
                             super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68.first.
                            super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_78 = ((long)(a_fields->v_instance).
                    super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(a_fields->v_instance).
                    super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + this->v_instance_fields;
  local_70 = this;
  t_derived<xemmai::t_type_of<xemmai::t_throwable>>::
  t_derived<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*,xemmai::t_object*&,unsigned_long_const&,unsigned_long,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>&,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>&>
            ((t_derived<xemmai::t_type_of<xemmai::t_throwable>> *)ptVar2->v_data,
             &t_bears<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,&local_70,
             &a_module_local,
             &t_derives<xemmai::t_throwable,_xemmai::t_type_of<xemmai::t_object>_>::c_NATIVE,
             &local_78,&local_68.first,&local_68.second);
  ptVar1 = (t_type *)this[-1].f_or;
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar2->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar2;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  std::
  pair<std::vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>,_std::map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>_>
  ::~pair(&local_68);
  return ptVar2;
}

Assistant:

t_object* t_type::f_derive(t_object* a_module, const t_fields& a_fields)
{
	auto [fields, key2index] = f_merge(a_fields);
	auto p = f_engine()->f_allocate_for_type<T>(fields.size());
	new(p->f_data()) T(T::c_IDS, this, a_module, T::c_NATIVE, v_instance_fields + a_fields.v_instance.size(), fields, key2index);
	p->f_be(t_object::f_of(this)->v_type);
	return p;
}